

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_greaterThan_ivec2(ShaderEvalContext *c)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined4 in_EAX;
  uint uVar3;
  int iVar4;
  float fVar5;
  int iVar6;
  
  uVar1 = *(undefined8 *)c->in[1].m_data;
  iVar4 = -(uint)((int)(float)uVar1 < (int)c->in[0].m_data[1]);
  iVar6 = -(uint)((int)(float)((ulong)uVar1 >> 0x20) < (int)c->in[0].m_data[3]);
  auVar2._4_4_ = iVar4;
  auVar2._0_4_ = iVar4;
  auVar2._8_4_ = iVar6;
  auVar2._12_4_ = iVar6;
  uVar3 = movmskpd(in_EAX,auVar2);
  if ((uVar3 & 2) == 0) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = 1.0;
  }
  (c->color).m_data[1] = fVar5;
  (c->color).m_data[2] = (float)(uVar3 & 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }